

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_0::allowed6(anon_unknown_0 *this,NetworkFilter *filter,StringPtr addrStr)

{
  byte bVar1;
  char *__cp;
  undefined2 local_3c [4];
  sockaddr_in6 addr;
  NetworkFilter *filter_local;
  StringPtr addrStr_local;
  
  addrStr_local.content.ptr = addrStr.content.ptr;
  addr._20_8_ = this;
  filter_local = filter;
  memset(local_3c,0,0x1c);
  local_3c[0] = 10;
  __cp = StringPtr::cStr((StringPtr *)&filter_local);
  inet_pton(10,__cp,&addr);
  bVar1 = (*(code *)**(undefined8 **)addr._20_8_)(addr._20_8_,local_3c,0x1c);
  return (bool)(bVar1 & 1);
}

Assistant:

bool allowed6(_::NetworkFilter& filter, StringPtr addrStr) {
  struct sockaddr_in6 addr;
  memset(&addr, 0, sizeof(addr));
  addr.sin6_family = AF_INET6;
  inet_pton(AF_INET6, addrStr.cStr(), &addr.sin6_addr);
  return filter.shouldAllow(reinterpret_cast<struct sockaddr*>(&addr), sizeof(addr));
}